

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbndmat.cpp
# Opt level: O0

void __thiscall
TPZSBMatrix<double>::TPZSBMatrix(TPZSBMatrix<double> *this,void **vtt,int64_t dim,int64_t band)

{
  _func_int **in_RCX;
  long in_RDX;
  void **in_RSI;
  TPZMatrix<double> *in_RDI;
  int64_t in_stack_ffffffffffffff98;
  TPZVec<double> *this_00;
  int64_t in_stack_ffffffffffffffa8;
  int64_t in_stack_ffffffffffffffb0;
  
  TPZMatrix<double>::TPZMatrix(in_RDI,in_RSI,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  (in_RDI->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable = (_func_int **)*in_RSI;
  TPZVec<double>::TPZVec((TPZVec<double> *)(in_RDI + 1));
  if (in_RDX + -1 < (long)in_RCX) {
    in_RCX = (_func_int **)(in_RDX + -1);
  }
  in_RDI[2].super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = in_RCX;
  this_00 = (TPZVec<double> *)(in_RDI + 1);
  (*(in_RDI->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])();
  TPZVec<double>::resize(this_00,in_stack_ffffffffffffff98);
  (*(in_RDI->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xf])();
  return;
}

Assistant:

TPZSBMatrix<TVar>::TPZSBMatrix( int64_t dim, int64_t band )
: TPZRegisterClassId(&TPZSBMatrix::ClassId),
TPZMatrix<TVar>( dim, dim )
{
    fBand = ( band > (dim - 1) ? (dim - 1) : band );
    fDiag.resize(Size());
    
    Zero();
}